

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CNullDriver.cpp
# Opt level: O1

void __thiscall
irr::video::CNullDriver::draw3DBox(CNullDriver *this,aabbox3d<float> *box,SColor color)

{
  vector3df edges [8];
  undefined1 local_98 [12];
  undefined1 auStack_8c [4];
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_48 = 0;
  uStack_40 = 0;
  local_58 = 0;
  uStack_50 = 0;
  local_68 = 0;
  uStack_60 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0;
  uStack_80 = 0;
  local_98._0_4_ = 0.0;
  local_98._4_4_ = 0.0;
  stack0xffffffffffffff70 = 0;
  core::aabbox3d<float>::getEdges(box,(vector3d<float> *)local_98);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,(long)&uStack_60 + 4,auStack_8c,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,auStack_8c,(long)&local_78 + 4,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,(long)&local_78 + 4,(long)&local_48 + 4,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,(long)&local_48 + 4,(long)&uStack_60 + 4,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,local_98,&uStack_80,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&uStack_80,&uStack_50,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,&uStack_50,&local_68,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])(this,&local_68,local_98,(ulong)color.color)
  ;
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,auStack_8c,local_98,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,(long)&local_78 + 4,&uStack_80,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,(long)&local_48 + 4,&uStack_50,(ulong)color.color);
  (*(this->super_IVideoDriver)._vptr_IVideoDriver[0x2d])
            (this,(long)&uStack_60 + 4,&local_68,(ulong)color.color);
  return;
}

Assistant:

void CNullDriver::draw3DBox(const core::aabbox3d<f32> &box, SColor color)
{
	core::vector3df edges[8];
	box.getEdges(edges);

	// TODO: optimize into one big drawIndexPrimitive call.

	draw3DLine(edges[5], edges[1], color);
	draw3DLine(edges[1], edges[3], color);
	draw3DLine(edges[3], edges[7], color);
	draw3DLine(edges[7], edges[5], color);
	draw3DLine(edges[0], edges[2], color);
	draw3DLine(edges[2], edges[6], color);
	draw3DLine(edges[6], edges[4], color);
	draw3DLine(edges[4], edges[0], color);
	draw3DLine(edges[1], edges[0], color);
	draw3DLine(edges[3], edges[2], color);
	draw3DLine(edges[7], edges[6], color);
	draw3DLine(edges[5], edges[4], color);
}